

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void growParserStack(TidyDocImpl *doc)

{
  TidyParserMemory *__dest;
  TidyParserMemory *content;
  TidyDocImpl *doc_local;
  
  __dest = (TidyParserMemory *)
           (*doc->allocator->vtbl->alloc)(doc->allocator,(ulong)(doc->stack).size * 0x60);
  memcpy(__dest,(doc->stack).content,(long)((doc->stack).top + 1) * 0x30);
  (*doc->allocator->vtbl->free)(doc->allocator,(doc->stack).content);
  (doc->stack).content = __dest;
  (doc->stack).size = (doc->stack).size << 1;
  return;
}

Assistant:

static void growParserStack( TidyDocImpl* doc )
{
    TidyParserMemory *content;
    content = (TidyParserMemory *) TidyAlloc( doc->allocator, sizeof(TidyParserMemory) * doc->stack.size * 2 );

    memcpy( content, doc->stack.content, sizeof(TidyParserMemory) * (doc->stack.top + 1) );
    TidyFree(doc->allocator, doc->stack.content);

    doc->stack.content = content;
    doc->stack.size = doc->stack.size * 2;
}